

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int planandnavigatexythetalat
              (PlannerType plannerType,char *envCfgFilename,char *motPrimFilename,bool forwardSearch
              )

{
  double dVar1;
  EnvNAVXYTHETALAT_InitParms EVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  double dVar6;
  double dVar7;
  char cVar8;
  byte bVar9;
  uint uVar10;
  undefined4 uVar11;
  void *__s;
  anaPlanner *this;
  long lVar12;
  ostream *poVar13;
  long *plVar14;
  FILE *__stream;
  clock_t cVar15;
  clock_t cVar16;
  runtime_error *prVar17;
  undefined7 in_register_00000009;
  long lVar18;
  vector *pvVar19;
  ulong uVar20;
  ulong uVar21;
  int y;
  int iVar22;
  PlannerType PVar23;
  long lVar24;
  int *piVar25;
  undefined8 *puVar26;
  char *pcVar27;
  PlannerType PVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  int iVar32;
  uint uVar33;
  uint uVar34;
  bool bVar35;
  byte bVar36;
  undefined4 uVar37;
  undefined8 in_stack_fffffffffffff9c8;
  undefined8 uVar38;
  double *pdVar39;
  double *pdVar40;
  double *pdVar41;
  double *pdVar42;
  double *pdVar43;
  double *pdVar44;
  double *pdVar45;
  vector *pvVar46;
  vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_> *pvVar47;
  int newtheta;
  int size_x;
  int newy;
  int newx;
  int size_y;
  uchar obsthresh;
  char *local_5c0;
  PlannerType local_5b8;
  int num_thetas;
  void *local_5b0;
  double starty;
  double startx;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> perimeterptsV;
  double starttheta;
  vector<int,_std::allocator<int>_> solution_stateIDs_V;
  sbpl_2Dpt_t local_558;
  double cellsize_m;
  double goaltheta;
  double goaly;
  double goalx;
  uint local_520;
  uint local_51c;
  vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> xythetaPath;
  vector<int,_std::allocator<int>_> preds_of_changededgesIDV;
  sbpl_2Dcell_t nav2dcell;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> changedcellsV;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> sensecells;
  MDPConfig MDPCfg;
  double timetoturn45degsinplace_secs;
  double nominalvel_mpersecs;
  vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_> motionprimitiveV;
  EnvironmentNAVXYTHETALAT environment_navxythetalat;
  EnvironmentNAVXYTHETALAT trueenvironment_navxythetalat;
  int local_88 [2];
  void *local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  bVar36 = 0;
  local_5b0 = (void *)CONCAT44(local_5b0._4_4_,(int)CONCAT71(in_register_00000009,forwardSearch));
  local_5b8 = plannerType;
  EnvironmentNAVXYTHETALATTICE::EnvironmentNAVXYTHETALATTICE
            ((EnvironmentNAVXYTHETALATTICE *)&environment_navxythetalat);
  _environment_navxythetalat = operator_delete__;
  EnvironmentNAVXYTHETALATTICE::EnvironmentNAVXYTHETALATTICE
            ((EnvironmentNAVXYTHETALATTICE *)&trueenvironment_navxythetalat);
  _trueenvironment_navxythetalat = operator_delete__;
  perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_558.x = -0.01;
  local_558.y = -0.01;
  std::vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>>::_M_realloc_insert<sbpl_2Dpt_t_const&>
            ((vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>> *)&perimeterptsV,(iterator)0x0,
             &local_558);
  local_558.x = 0.01;
  local_558.y = -0.01;
  if (perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>>::_M_realloc_insert<sbpl_2Dpt_t_const&>
              ((vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>> *)&perimeterptsV,
               (iterator)
               perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_558);
  }
  else {
    (perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
     super__Vector_impl_data._M_finish)->x = 0.01;
    (perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
     super__Vector_impl_data._M_finish)->y = -0.01;
    perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
    super__Vector_impl_data._M_finish =
         perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_558.x = 0.01;
  local_558.y = 0.01;
  if (perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>>::_M_realloc_insert<sbpl_2Dpt_t_const&>
              ((vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>> *)&perimeterptsV,
               (iterator)
               perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_558);
  }
  else {
    (perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
     super__Vector_impl_data._M_finish)->x = 0.01;
    (perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
     super__Vector_impl_data._M_finish)->y = 0.01;
    perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
    super__Vector_impl_data._M_finish =
         perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_558.x = -0.01;
  local_558.y = 0.01;
  if (perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>>::_M_realloc_insert<sbpl_2Dpt_t_const&>
              ((vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>> *)&perimeterptsV,
               (iterator)
               perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_558);
  }
  else {
    (perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
     super__Vector_impl_data._M_finish)->x = -0.01;
    (perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
     super__Vector_impl_data._M_finish)->y = 0.01;
    perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
    super__Vector_impl_data._M_finish =
         perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  cVar8 = EnvironmentNAVXYTHETALATTICE::InitializeEnv((char *)&trueenvironment_navxythetalat);
  local_5c0 = motPrimFilename;
  if (cVar8 == '\0') {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar17,"ERROR: InitializeEnv failed");
    *(undefined ***)prVar17 = &PTR__runtime_error_0010ec48;
    __cxa_throw(prVar17,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  size_x = -1;
  size_y = -1;
  num_thetas = -1;
  startx = -1.0;
  starty = -1.0;
  pdVar39 = &starttheta;
  starttheta = -1.0;
  pdVar40 = &goalx;
  goalx = -1.0;
  pdVar41 = &goaly;
  goaly = -1.0;
  pdVar42 = &goaltheta;
  goaltheta = -1.0;
  pdVar43 = &cellsize_m;
  cellsize_m = 0.0;
  pdVar44 = &nominalvel_mpersecs;
  nominalvel_mpersecs = 0.0;
  pdVar45 = &timetoturn45degsinplace_secs;
  timetoturn45degsinplace_secs = 0.0;
  pvVar46 = (vector *)&obsthresh;
  obsthresh = '\0';
  pvVar47 = &motionprimitiveV;
  motionprimitiveV.
  super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  motionprimitiveV.
  super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  motionprimitiveV.
  super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar38 = 0x108472;
  EnvironmentNAVXYTHETALATTICE::GetEnvParms
            ((int *)&trueenvironment_navxythetalat,&size_x,&size_y,(double *)&num_thetas,&startx,
             &starty,pdVar39,pdVar40,pdVar41,pdVar42,pdVar43,pdVar44,(uchar *)pdVar45,pvVar46);
  EnvironmentNAVXYTHETALATTICE::GetEnvParameter((char *)&trueenvironment_navxythetalat);
  EnvironmentNAVXYTHETALATTICE::GetEnvParameter((char *)&trueenvironment_navxythetalat);
  puts("true map:");
  if (0 < size_y) {
    iVar30 = 0;
    do {
      if (0 < size_x) {
        iVar22 = 0;
        do {
          bVar9 = EnvironmentNAVXYTHETALATTICE::GetMapCost
                            ((int)&trueenvironment_navxythetalat,iVar22);
          printf("%3d ",(ulong)bVar9);
          iVar22 = iVar22 + 1;
        } while (iVar22 < size_x);
      }
      putchar(10);
      iVar30 = iVar30 + 1;
    } while (iVar30 < size_y);
  }
  system("pause");
  printf("System Pause (return=%d)\n");
  uVar20 = (long)size_y * (long)size_x;
  __s = operator_new__(uVar20);
  if (0 < (int)uVar20) {
    memset(__s,0,uVar20 & 0xffffffff);
  }
  printf("start: %f %f %f, goal: %f %f %f\n",SUB84(startx,0),starty,starttheta,SUB84(goalx,0),goaly,
         goaltheta);
  cVar8 = EnvironmentNAVXYTHETALATTICE::SetEnvParameter((char *)&environment_navxythetalat,0x10b6e2)
  ;
  if (cVar8 == '\0') {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar17,"ERROR: failed to set parameters");
LAB_001095b8:
    *(undefined ***)prVar17 = &PTR__runtime_error_0010ec48;
    __cxa_throw(prVar17,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar8 = EnvironmentNAVXYTHETALATTICE::SetEnvParameter((char *)&environment_navxythetalat,0x10b6f8)
  ;
  dVar7 = nominalvel_mpersecs;
  dVar6 = timetoturn45degsinplace_secs;
  dVar1 = cellsize_m;
  iVar30 = size_x;
  if (cVar8 == '\0') {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar17,"ERROR: failed to set parameters");
    goto LAB_001095b8;
  }
  pvVar19 = (vector *)(ulong)(uint)size_y;
  pcVar27 = (char *)(ulong)obsthresh;
  local_88[0] = num_thetas;
  local_80 = __s;
  local_78 = startx;
  local_70 = starty;
  local_68 = starttheta;
  local_60 = goalx;
  local_58 = goaly;
  local_50 = goaltheta;
  local_48 = 0x3f50624dd2f1a9fc;
  uStack_40 = 0x3f50624dd2f1a9fc;
  local_38 = 0x3f50624dd2f1a9fc;
  piVar25 = local_88;
  puVar26 = (undefined8 *)&stack0xfffffffffffff9c8;
  for (lVar18 = 0xb; lVar18 != 0; lVar18 = lVar18 + -1) {
    *puVar26 = *(undefined8 *)piVar25;
    piVar25 = piVar25 + ((ulong)bVar36 * -2 + 1) * 2;
    puVar26 = puVar26 + (ulong)bVar36 * -2 + 1;
  }
  EVar2.mapdata = (uchar *)uVar38;
  EVar2._0_8_ = in_stack_fffffffffffff9c8;
  EVar2.startx = (double)pdVar39;
  EVar2.starty = (double)pdVar40;
  EVar2.starttheta = (double)pdVar41;
  EVar2.goalx = (double)pdVar42;
  EVar2.goaly = (double)pdVar43;
  EVar2.goaltheta = (double)pdVar44;
  EVar2.goaltol_x = (double)pdVar45;
  EVar2.goaltol_y = (double)pvVar46;
  EVar2.goaltol_theta = (double)pvVar47;
  cVar8 = EnvironmentNAVXYTHETALATTICE::InitializeEnv
                    ((int)&environment_navxythetalat,iVar30,pvVar19,dVar1,dVar7,dVar6,
                     (uchar)&perimeterptsV,pcVar27,EVar2);
  if (cVar8 == '\0') {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar17,"ERROR: InitializeEnv failed");
    *(undefined ***)prVar17 = &PTR__runtime_error_0010ec48;
    __cxa_throw(prVar17,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  EnvironmentNAVXYTHETALAT::SetStart(startx,starty,starttheta);
  EnvironmentNAVXYTHETALAT::SetGoal(goalx,goaly,goaltheta);
  cVar8 = EnvironmentNAVXYTHETALATTICE::InitializeMDPCfg((MDPConfig *)&environment_navxythetalat);
  if (cVar8 == '\0') {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar17,"ERROR: InitializeMDPCfg failed");
    *(undefined ***)prVar17 = &PTR__runtime_error_0010ec48;
    __cxa_throw(prVar17,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  switch(local_5b8) {
  case PLANNER_TYPE_ADSTAR:
    puts("Initializing ADPlanner...");
    this = (anaPlanner *)operator_new(0x98);
    ADPlanner::ADPlanner
              ((ADPlanner *)this,(DiscreteSpaceInformation *)&environment_navxythetalat,
               local_5b0._0_1_);
    break;
  case PLANNER_TYPE_ARASTAR:
    puts("Initializing ARAPlanner...");
    this = (anaPlanner *)operator_new(0xa0);
    ARAPlanner::ARAPlanner
              ((ARAPlanner *)this,(DiscreteSpaceInformation *)&environment_navxythetalat,
               local_5b0._0_1_);
    break;
  default:
    puts("Invalid planner type");
    this = (anaPlanner *)0x0;
    break;
  case PLANNER_TYPE_RSTAR:
    puts("Invalid configuration: xytheta environment does not support rstar planner...");
    iVar30 = 0;
    goto LAB_00109430;
  case PLANNER_TYPE_ANASTAR:
    puts("Initializing anaPlanner...");
    this = (anaPlanner *)operator_new(0x48);
    anaPlanner::anaPlanner
              (this,(DiscreteSpaceInformation *)&environment_navxythetalat,local_5b0._0_1_);
  }
  iVar30 = (**(code **)(*(long *)this + 0x28))(this,MDPCfg.startstateid);
  if (iVar30 == 0) {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar17,"ERROR: failed to set start state");
  }
  else {
    iVar30 = (**(code **)(*(long *)this + 0x20))(this,MDPCfg.goalstateid);
    if (iVar30 != 0) {
      (**(code **)(*(long *)this + 0x90))(0,this);
      (**(code **)(*(long *)this + 0x40))(this,0);
      sensecells.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      sensecells.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      sensecells.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_5b0 = __s;
      lVar12 = EnvironmentNAVXYTHETALATTICE::GetEnvNavConfig();
      lVar18 = *(long *)(lVar12 + 0xd8);
      uVar20 = (*(long *)(lVar12 + 0xe0) - lVar18 >> 3) * 0x6db6db6db6db6db7;
      uVar11 = 0;
      uVar37 = 0;
      if (0 < (int)uVar20) {
        lVar24 = 0x10;
        uVar31 = 0;
        do {
          if (uVar20 <= uVar31) goto LAB_001094aa;
          iVar30 = *(int *)(lVar18 + -4 + lVar24);
          iVar22 = *(int *)(lVar18 + lVar24);
          local_5c0 = (char *)(double)(iVar22 * iVar22 + iVar30 * iVar30);
          if ((double)CONCAT44(uVar37,uVar11) <= (double)local_5c0 &&
              (double)local_5c0 != (double)CONCAT44(uVar37,uVar11)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Found a longer motion primitive with dx = ",0x2a);
            poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar30);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13," and dy = ",10);
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar22);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13," from starttheta = ",0x13);
            plVar14 = (long *)std::ostream::operator<<
                                        (poVar13,(uint)*(byte *)(lVar18 + -0xc + lVar24));
            std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
            std::ostream::put((char)plVar14);
            std::ostream::flush();
            uVar11 = SUB84(local_5c0,0);
            uVar37 = (undefined4)((ulong)local_5c0 >> 0x20);
          }
          uVar31 = uVar31 + 1;
          lVar18 = *(long *)(lVar12 + 0xd8);
          uVar20 = (*(long *)(lVar12 + 0xe0) - lVar18 >> 3) * 0x6db6db6db6db6db7;
          lVar24 = lVar24 + 0x38;
        } while ((long)uVar31 < (long)(int)uVar20);
      }
      if ((double)CONCAT44(uVar37,uVar11) < 0.0) {
        local_5c0 = (char *)sqrt((double)CONCAT44(uVar37,uVar11));
      }
      else {
        local_5c0 = (char *)SQRT((double)CONCAT44(uVar37,uVar11));
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Maximum motion primitive length: ",0x21);
      poVar13 = std::ostream::_M_insert<double>((double)local_5c0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      dVar1 = ceil((double)local_5c0);
      uVar10 = (uint)dVar1;
      local_5c0 = (char *)(ulong)uVar10;
      if (-1 < (int)uVar10) {
        iVar32 = -uVar10;
        local_5b8 = uVar10 * 2 + PLANNER_TYPE_ARASTAR;
        PVar28 = local_5b8;
        iVar30 = iVar32;
        iVar22 = iVar32;
        do {
          do {
            preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar30,iVar22);
            std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::emplace_back<sbpl_2Dcell_t>
                      (&sensecells,(sbpl_2Dcell_t *)&preds_of_changededgesIDV);
            PVar28 = PVar28 + INVALID_PLANNER_TYPE;
            iVar30 = iVar30 + 1;
          } while (PVar28 != PLANNER_TYPE_ADSTAR);
          bVar35 = iVar22 != (PlannerType)local_5c0;
          PVar28 = local_5b8;
          iVar30 = iVar32;
          iVar22 = iVar22 + 1;
        } while (bVar35);
      }
      __stream = fopen("sol.txt","w");
      if (__stream == (FILE *)0x0) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar17,"ERROR: could not open solution file");
        *(undefined ***)prVar17 = &PTR__runtime_error_0010ec48;
        __cxa_throw(prVar17,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar10 = (int)(goalx / cellsize_m) - (uint)(goalx < 0.0);
      uVar31 = (ulong)uVar10;
      uVar33 = (int)(goaly / cellsize_m) - (uint)(goaly < 0.0);
      ContTheta2Disc(goaltheta,num_thetas);
      printf("goal_c: %d %d %d\n",uVar31,(ulong)uVar33);
      preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      nav2dcell.x = 0;
      nav2dcell.y = 0;
      xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      while (((0.001 < ABS(startx - goalx) || (0.001 < ABS(starty - goaly))) ||
             (0.001 < ABS(starttheta - goaltheta)))) {
        if (preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        if (changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
            super__Vector_impl_data._M_start) {
          changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
          super__Vector_impl_data._M_finish =
               changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        uVar20 = (long)sensecells.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)sensecells.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        if ((int)uVar20 < 1) {
          bVar35 = false;
        }
        else {
          uVar21 = 0;
          bVar35 = false;
          do {
            iVar30 = size_x;
            if (uVar20 <= uVar21) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar21);
              goto LAB_001094aa;
            }
            uVar34 = ((int)(startx / cellsize_m) - (uint)(startx < 0.0)) +
                     sensecells.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar21].x;
            if (((-1 < (int)uVar34) && (uVar31 = (ulong)(uint)size_x, (int)uVar34 < size_x)) &&
               ((uVar29 = ((int)(starty / cellsize_m) - (uint)(starty < 0.0)) +
                          sensecells.
                          super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar21].y, -1 < (int)uVar29 &&
                ((int)uVar29 < size_y)))) {
              cVar8 = EnvironmentNAVXYTHETALATTICE::GetMapCost
                                ((int)&trueenvironment_navxythetalat,uVar34);
              uVar31 = (ulong)(iVar30 * uVar29);
              lVar18 = uVar34 + uVar31;
              if (*(char *)((long)local_5b0 + lVar18) != cVar8) {
                *(char *)((long)local_5b0 + lVar18) = cVar8;
                EnvironmentNAVXYTHETALATTICE::UpdateCost
                          ((int)&environment_navxythetalat,uVar34,(uchar)uVar29);
                printf("setting cost[%d][%d] to %d\n",(ulong)uVar34,(ulong)uVar29,
                       (ulong)*(byte *)((long)local_5b0 + lVar18));
                nav2dcell.y = uVar29;
                nav2dcell.x = uVar34;
                if (changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  bVar35 = true;
                  std::vector<sbpl_2Dcell_t,std::allocator<sbpl_2Dcell_t>>::
                  _M_realloc_insert<sbpl_2Dcell_t_const&>
                            ((vector<sbpl_2Dcell_t,std::allocator<sbpl_2Dcell_t>> *)&changedcellsV,
                             (iterator)
                             changedcellsV.
                             super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                             _M_impl.super__Vector_impl_data._M_finish,&nav2dcell);
                }
                else {
                  *changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish = nav2dcell;
                  changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       changedcellsV.
                       super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                  bVar35 = true;
                }
              }
            }
            uVar21 = uVar21 + 1;
            uVar20 = (long)sensecells.
                           super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)sensecells.
                           super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3;
          } while ((long)uVar21 <
                   (long)(int)((ulong)((long)sensecells.
                                             super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)sensecells.
                                            super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3));
        }
        cVar15 = clock();
        if (bVar35) {
          lVar18 = __dynamic_cast(this,&SBPLPlanner::typeinfo,&ARAPlanner::typeinfo);
          if (lVar18 == 0) {
            lVar18 = __dynamic_cast(this,&SBPLPlanner::typeinfo,&ADPlanner::typeinfo);
            if (lVar18 != 0) {
              EnvironmentNAVXYTHETALAT::GetPredsofChangedEdges
                        ((vector *)&environment_navxythetalat,(vector *)&changedcellsV);
              (**(code **)(*(long *)this + 0xb0))(this,&preds_of_changededgesIDV);
              printf("%d states were affected\n",
                     (ulong)((long)preds_of_changededgesIDV.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)preds_of_changededgesIDV.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
            }
          }
          else {
            (**(code **)(*(long *)this + 0xa8))(this);
          }
        }
        local_51c = (int)(startx / cellsize_m) - (uint)(startx < 0.0);
        local_520 = (int)(starty / cellsize_m) - (uint)(starty < 0.0);
        uVar34 = ContTheta2Disc(starttheta,num_thetas);
        puts("new planning...");
        iVar30 = (*(code *)**(undefined8 **)this)(0,this,&solution_stateIDs_V);
        piVar5 = solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar4 = solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (**(code **)(*(long *)this + 0x50))(this);
        printf("done with the solution of size=%d and sol. eps=%f\n",
               (ulong)((long)piVar5 - (long)piVar4) >> 2 & 0xffffffff);
        EnvironmentNAVXYTHETALATTICE::PrintTimeStat((_IO_FILE *)&environment_navxythetalat);
        cVar16 = clock();
        uVar38 = (**(code **)(*(long *)this + 0x50))(this);
        fprintf(__stream,"plan time=%.5f eps=%.2f\n",
                SUB84(((double)cVar16 - (double)cVar15) / 1000000.0,0),uVar38);
        fflush(__stream);
        if (xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               xythetaPath.
               super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        EnvironmentNAVXYTHETALAT::ConvertStateIDPathintoXYThetaPath
                  ((vector *)&environment_navxythetalat,(vector *)&solution_stateIDs_V);
        printf("actual path (with intermediate poses) size=%d\n",
               (ulong)(uint)((int)((ulong)((long)xythetaPath.
                                                 super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)xythetaPath.
                                                super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                            -0x55555555));
        if (xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          uVar20 = 0;
          uVar31 = 1;
          do {
            fprintf(__stream,"%.3f %.3f %.3f\n",
                    (int)*(undefined8 *)
                          (xythetaPath.
                           super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar20 * 0x18),
                    *(undefined8 *)
                     (xythetaPath.
                      super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar20 * 0x18 + 8),
                    *(undefined8 *)
                     (xythetaPath.
                      super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar20 * 0x18 + 0x10));
            uVar20 = ((long)xythetaPath.
                            super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)xythetaPath.
                            super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
            bVar35 = uVar31 <= uVar20;
            lVar18 = uVar20 - uVar31;
            uVar20 = uVar31;
            uVar31 = (ulong)((int)uVar31 + 1);
          } while (bVar35 && lVar18 != 0);
        }
        fwrite("*********\n",10,1,__stream);
        uVar31 = (ulong)uVar33;
        if (1 < (int)((ulong)((long)solution_stateIDs_V.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 2)) {
          lVar18 = 1;
          do {
            newtheta = 0;
            EnvironmentNAVXYTHETALAT::GetCoordFromState
                      ((int)&environment_navxythetalat,
                       (int *)(ulong)(uint)solution_stateIDs_V.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start[lVar18],&newx,&newy);
            fprintf(__stream,"%d %d %d\n",(ulong)(uint)newx,(ulong)(uint)newy,0);
            lVar18 = lVar18 + 1;
          } while (lVar18 < (int)((ulong)((long)solution_stateIDs_V.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)solution_stateIDs_V.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start) >> 2));
        }
        fflush(__stream);
        if (0 < size_y) {
          local_5c0 = (char *)CONCAT44(local_5c0._4_4_,size_x * local_520 + local_51c);
          PVar28 = size_x * uVar33 + uVar10;
          iVar22 = 0;
          local_5b8 = PVar28;
          do {
            if (0 < size_x) {
              iVar32 = 0;
              do {
                iVar3 = size_x;
                uVar29 = EnvironmentNAVXYTHETALATTICE::GetMapCost
                                   ((int)&environment_navxythetalat,iVar32);
                if ((int)((ulong)((long)solution_stateIDs_V.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)solution_stateIDs_V.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start) >> 2) < 2) {
                  uVar31 = 0;
                }
                else {
                  lVar18 = 1;
                  uVar31 = 0;
                  do {
                    newtheta = 0;
                    EnvironmentNAVXYTHETALAT::GetCoordFromState
                              ((int)&environment_navxythetalat,
                               (int *)(ulong)(uint)solution_stateIDs_V.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start[lVar18],
                               &newx,&newy);
                    if (newy == iVar22 && newx == iVar32) {
                      uVar31 = 1;
                    }
                    lVar18 = lVar18 + 1;
                    PVar28 = local_5b8;
                  } while (lVar18 < (int)((ulong)((long)solution_stateIDs_V.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                 (long)solution_stateIDs_V.
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_start) >>
                                         2));
                }
                PVar23 = iVar3 * iVar22 + iVar32;
                if (((PVar23 == (PlannerType)local_5c0) || (PVar23 == PVar28)) || (uVar31 != 0)) {
                  if (PVar23 == (PlannerType)local_5c0) {
                    pcVar27 = "  X ";
                  }
                  else if (PVar23 == PVar28) {
                    pcVar27 = "  G ";
                  }
                  else if (uVar31 == 0) {
                    pcVar27 = "? ";
                  }
                  else {
                    pcVar27 = "  * ";
                  }
                  printf(pcVar27);
                }
                else {
                  printf("%3d ",(ulong)uVar29 & 0xff);
                }
                iVar32 = iVar32 + 1;
              } while (iVar32 < size_x);
            }
            putchar(10);
            iVar22 = iVar22 + 1;
          } while (iVar22 < size_y);
        }
        if ((iVar30 == 1) &&
           (1 < (int)((ulong)((long)xythetaPath.
                                    super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)xythetaPath.
                                   super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555))
        {
          EnvironmentNAVXYTHETALAT::GetCoordFromState
                    ((int)&environment_navxythetalat,
                     (int *)(ulong)(uint)solution_stateIDs_V.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start[1],&newx,&newy);
          printf("moving from %d %d %d to %d %d %d\n",(ulong)local_51c,(ulong)local_520,
                 (ulong)uVar34,(ulong)(uint)newx,(ulong)(uint)newy);
          cVar8 = EnvironmentNAVXYTHETALATTICE::IsValidConfiguration
                            ((int)&trueenvironment_navxythetalat,newx,newy);
          if (cVar8 == '\0') goto LAB_001094bb;
          startx = (double)newx * cellsize_m + cellsize_m * 0.5;
          starty = (double)newy * cellsize_m + cellsize_m * 0.5;
          starttheta = (double)DiscTheta2Cont(newtheta,num_thetas);
          uVar11 = EnvironmentNAVXYTHETALAT::SetStart(startx,starty,starttheta);
          iVar30 = (**(code **)(*(long *)this + 0x28))(this,uVar11);
          if (iVar30 == 0) {
            prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar17,"ERROR: failed to update robot pose in the planner");
            *(undefined ***)prVar17 = &PTR__runtime_error_0010ec48;
            __cxa_throw(prVar17,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        else {
          puts("No move is made");
        }
      }
      puts("goal reached!");
      fflush((FILE *)0x0);
      fclose(__stream);
      operator_delete__(local_5b0);
      (**(code **)(*(long *)this + 0xa0))();
      if (xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(xythetaPath.
                        super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)xythetaPath.
                              super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)xythetaPath.
                              super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(changedcellsV.
                        super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)changedcellsV.
                              super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)changedcellsV.
                              super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (sensecells.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(sensecells.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)sensecells.
                              super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)sensecells.
                              super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      iVar30 = 1;
LAB_00109430:
      if (solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::~vector
                (&motionprimitiveV);
      if (perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)perimeterptsV.
                              super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)perimeterptsV.
                              super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      EnvironmentNAVXYTHETALAT::~EnvironmentNAVXYTHETALAT(&trueenvironment_navxythetalat);
      EnvironmentNAVXYTHETALAT::~EnvironmentNAVXYTHETALAT(&environment_navxythetalat);
      return iVar30;
    }
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar17,"ERROR: failed to set goal state");
  }
  *(undefined ***)prVar17 = &PTR__runtime_error_0010ec48;
  __cxa_throw(prVar17,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
LAB_001094aa:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar31);
LAB_001094bb:
  prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (prVar17,
             "ERROR: robot is commanded to move into an invalid configuration according to true environment"
            );
  *(undefined ***)prVar17 = &PTR__runtime_error_0010ec48;
  __cxa_throw(prVar17,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int planandnavigatexythetalat(PlannerType plannerType, char* envCfgFilename, char* motPrimFilename, bool forwardSearch)
{
    double allocated_time_secs_foreachplan = 10.0; // in seconds
    double initialEpsilon = 3.0;
    bool bsearchuntilfirstsolution = false;
    bool bforwardsearch = forwardSearch;

    double goaltol_x = 0.001, goaltol_y = 0.001, goaltol_theta = 0.001;

    bool bPrint = false;
    bool bPrintMap = true;

    EnvironmentNAVXYTHETALAT environment_navxythetalat;
    EnvironmentNAVXYTHETALAT trueenvironment_navxythetalat;

    // set the perimeter of the robot
    // it is given with 0, 0, 0 robot ref. point for which planning is done.
    vector<sbpl_2Dpt_t> perimeterptsV;
    sbpl_2Dpt_t pt_m;
    double halfwidth = 0.01;
    double halflength = 0.01;
    pt_m.x = -halflength;
    pt_m.y = -halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = -halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = -halflength;
    pt_m.y = halfwidth;
    perimeterptsV.push_back(pt_m);

    //	perimeterptsV.clear();

    // initialize true map from the environment file without perimeter or motion primitives
    if (!trueenvironment_navxythetalat.InitializeEnv(envCfgFilename)) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    // environment parameters
    int size_x = -1, size_y = -1, num_thetas = -1;
    double startx = -1, starty = -1, starttheta = -1;
    double goalx = -1, goaly = -1, goaltheta = -1;
    double cellsize_m = 0.0, nominalvel_mpersecs = 0.0, timetoturn45degsinplace_secs = 0.0;
    unsigned char obsthresh = 0;
    vector<SBPL_xytheta_mprimitive> motionprimitiveV;

    // additional environment parameters
    unsigned char costinscribed_thresh = 0;
    unsigned char costcircum_thresh = 0;

    // get environment parameters from the true environment
    trueenvironment_navxythetalat.GetEnvParms(&size_x, &size_y, &num_thetas, &startx, &starty, &starttheta, &goalx,
                                              &goaly, &goaltheta, &cellsize_m, &nominalvel_mpersecs,
                                              &timetoturn45degsinplace_secs, &obsthresh, &motionprimitiveV);
    costinscribed_thresh = trueenvironment_navxythetalat.GetEnvParameter("cost_inscribed_thresh");
    costcircum_thresh = trueenvironment_navxythetalat.GetEnvParameter("cost_possibly_circumscribed_thresh");

    // print the map
    if (bPrintMap) {
        printf("true map:\n");
        for (int y = 0; y < size_y; y++) {
            for (int x = 0; x < size_x; x++) {
                printf("%3d ", trueenvironment_navxythetalat.GetMapCost(x, y));
            }
            printf("\n");
        }
        printf("System Pause (return=%d)\n", system("pause"));
    }

    // create an empty map
    unsigned char* map = new unsigned char[size_x * size_y];
    for (int i = 0; i < size_x * size_y; i++) {
        map[i] = 0;
    }

    // check the start and goal obtained from the true environment
    printf("start: %f %f %f, goal: %f %f %f\n", startx, starty, starttheta, goalx, goaly, goaltheta);

    // set robot environment parameters (should be done before initialize function is called)
    if (!environment_navxythetalat.SetEnvParameter("cost_inscribed_thresh", costinscribed_thresh)) {
        throw SBPL_Exception("ERROR: failed to set parameters");
    }
    if (!environment_navxythetalat.SetEnvParameter("cost_possibly_circumscribed_thresh", costcircum_thresh)) {
        throw SBPL_Exception("ERROR: failed to set parameters");
    }

    // initialize environment (should be called before initializing anything else)
    EnvNAVXYTHETALAT_InitParms params;
    params.startx = startx;
    params.starty = starty;
    params.starttheta = starttheta;
    params.goalx = goalx;
    params.goaly = goaly;
    params.goaltheta = goaltheta;
    params.goaltol_x = goaltol_x;
    params.goaltol_y = goaltol_y;
    params.goaltol_theta = goaltol_theta;
    params.mapdata = map;
    params.numThetas = num_thetas;

    bool envInitialized = environment_navxythetalat.InitializeEnv(size_x, size_y, perimeterptsV, cellsize_m,
                                                                  nominalvel_mpersecs, timetoturn45degsinplace_secs,
                                                                  obsthresh, motPrimFilename, params);

    if (!envInitialized) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    // set start and goal states
    environment_navxythetalat.SetStart(startx, starty, starttheta);
    environment_navxythetalat.SetGoal(goalx, goaly, goaltheta);

    MDPConfig MDPCfg;

    // initialize MDP info
    if (!environment_navxythetalat.InitializeMDPCfg(&MDPCfg)) {
        throw SBPL_Exception("ERROR: InitializeMDPCfg failed");
    }

    // create a planner
    vector<int> solution_stateIDs_V;

    SBPLPlanner* planner = NULL;
    switch (plannerType) {
    case PLANNER_TYPE_ARASTAR:
        printf("Initializing ARAPlanner...\n");
        planner = new ARAPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    case PLANNER_TYPE_ADSTAR:
        printf("Initializing ADPlanner...\n");
        planner = new ADPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    case PLANNER_TYPE_RSTAR:
        printf("Invalid configuration: xytheta environment does not support rstar planner...\n");
        return 0;
    case PLANNER_TYPE_ANASTAR:
        printf("Initializing anaPlanner...\n");
        planner = new anaPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    default:
        printf("Invalid planner type\n");
        break;
    }

    // set the start and goal states for the planner and other search variables
    if (planner->set_start(MDPCfg.startstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set start state");
    }
    if (planner->set_goal(MDPCfg.goalstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set goal state");
    }
    planner->set_initialsolution_eps(initialEpsilon);
    planner->set_search_mode(bsearchuntilfirstsolution);

    // compute sensing as a square surrounding the robot with length twice that of the
    // longest motion primitive
    vector<sbpl_2Dcell_t> sensecells;
    double maxMotPrimLengthSquared = 0.0;
    double maxMotPrimLength = 0.0;
    const EnvNAVXYTHETALATConfig_t* cfg = environment_navxythetalat.GetEnvNavConfig();
    for (int i = 0; i < (int)cfg->mprimV.size(); i++) {
        const SBPL_xytheta_mprimitive& mprim = cfg->mprimV.at(i);
        int dx = mprim.endcell.x;
        int dy = mprim.endcell.y;
        if (dx * dx + dy * dy > maxMotPrimLengthSquared) {
            std::cout << "Found a longer motion primitive with dx = " << dx << " and dy = " << dy
                << " from starttheta = " << (int)mprim.starttheta_c << std::endl;
            maxMotPrimLengthSquared = dx * dx + dy * dy;
        }
    }
    maxMotPrimLength = sqrt((double)maxMotPrimLengthSquared);
    std::cout << "Maximum motion primitive length: " << maxMotPrimLength << std::endl;

    int sensingRange = (int)ceil(maxMotPrimLength);
    for (int x = -sensingRange; x <= sensingRange; x++) {
        for (int y = -sensingRange; y <= sensingRange; y++) {
            sensecells.push_back(sbpl_2Dcell_t(x, y));
        }
    }

    // create a file to hold the solution vector
    const char* sol = "sol.txt";
    FILE* fSol = fopen(sol, "w");
    if (fSol == NULL) {
        throw SBPL_Exception("ERROR: could not open solution file");
    }

    // print the goal pose
    int goalx_c = CONTXY2DISC(goalx, cellsize_m);
    int goaly_c = CONTXY2DISC(goaly, cellsize_m);
    int goaltheta_c = ContTheta2Disc(goaltheta, num_thetas);
    printf("goal_c: %d %d %d\n", goalx_c, goaly_c, goaltheta_c);

    vector<int> preds_of_changededgesIDV;
    vector<nav2dcell_t> changedcellsV;
    nav2dcell_t nav2dcell;
    vector<sbpl_xy_theta_pt_t> xythetaPath;

    // now comes the main loop
    while (fabs(startx - goalx) > goaltol_x || fabs(starty - goaly) > goaltol_y || fabs(starttheta - goaltheta)
        > goaltol_theta) {
        //simulate sensor data update
        bool bChanges = false;
        preds_of_changededgesIDV.clear();
        changedcellsV.clear();

        // simulate sensing the cells
        for (int i = 0; i < (int)sensecells.size(); i++) {
            int x = CONTXY2DISC(startx, cellsize_m) + sensecells.at(i).x;
            int y = CONTXY2DISC(starty, cellsize_m) + sensecells.at(i).y;

            // ignore if outside the map
            if (x < 0 || x >= size_x || y < 0 || y >= size_y) {
                continue;
            }

            int index = x + y * size_x;
            unsigned char truecost = trueenvironment_navxythetalat.GetMapCost(x, y);
            // update the cell if we haven't seen it before
            if (map[index] != truecost) {
                map[index] = truecost;
                environment_navxythetalat.UpdateCost(x, y, map[index]);
                printf("setting cost[%d][%d] to %d\n", x, y, map[index]);
                bChanges = true;
                // store the changed cells
                nav2dcell.x = x;
                nav2dcell.y = y;
                changedcellsV.push_back(nav2dcell);
            }
        }

        double TimeStarted = clock();

        // if necessary notify the planner of changes to costmap
        if (bChanges) {
            if (dynamic_cast<ARAPlanner*> (planner) != NULL) {
                ((ARAPlanner*)planner)->costs_changed(); //use by ARA* planner (non-incremental)
            }
            else if (dynamic_cast<ADPlanner*> (planner) != NULL) {
                // get the affected states
                environment_navxythetalat.GetPredsofChangedEdges(&changedcellsV, &preds_of_changededgesIDV);
                // let know the incremental planner about them
                //use by AD* planner (incremental)
                ((ADPlanner*)planner)->update_preds_of_changededges(&preds_of_changededgesIDV);
                printf("%d states were affected\n", (int)preds_of_changededgesIDV.size());
            }
        }

        int startx_c = CONTXY2DISC(startx, cellsize_m);
        int starty_c = CONTXY2DISC(starty, cellsize_m);
        int starttheta_c = ContTheta2Disc(starttheta, num_thetas);

        // plan a path
        bool bPlanExists = false;

        printf("new planning...\n");
        bPlanExists = (planner->replan(allocated_time_secs_foreachplan, &solution_stateIDs_V) == 1);
        printf("done with the solution of size=%d and sol. eps=%f\n", (unsigned int)solution_stateIDs_V.size(),
               planner->get_solution_eps());
        environment_navxythetalat.PrintTimeStat(stdout);

        // write the solution to sol.txt
        fprintf(fSol, "plan time=%.5f eps=%.2f\n", (clock() - TimeStarted) / ((double)CLOCKS_PER_SEC),
                planner->get_solution_eps());
        fflush(fSol);

        xythetaPath.clear();
        environment_navxythetalat.ConvertStateIDPathintoXYThetaPath(&solution_stateIDs_V, &xythetaPath);
        printf("actual path (with intermediate poses) size=%d\n", (unsigned int)xythetaPath.size());
        for (unsigned int i = 0; i < xythetaPath.size(); i++) {
            fprintf(fSol, "%.3f %.3f %.3f\n", xythetaPath.at(i).x, xythetaPath.at(i).y, xythetaPath.at(i).theta);
        }
        fprintf(fSol, "*********\n");

        for (int j = 1; j < (int)solution_stateIDs_V.size(); j++) {
            int newx, newy, newtheta = 0;
            environment_navxythetalat.GetCoordFromState(solution_stateIDs_V[j], newx, newy, newtheta);
            fprintf(fSol, "%d %d %d\n", newx, newy, newtheta);
        }
        fflush(fSol);

        // print the map (robot's view of the world and current plan)
        int startindex = startx_c + starty_c * size_x;
        int goalindex = goalx_c + goaly_c * size_x;
        for (int y = 0; bPrintMap && y < size_y; y++) {
            for (int x = 0; x < size_x; x++) {
                int index = x + y * size_x;
                int cost = map[index];
                cost = environment_navxythetalat.GetMapCost(x, y);

                // check to see if it is on the path
                bool bOnthePath = false;
                for (int j = 1; j < (int)solution_stateIDs_V.size(); j++) {
                    int newx, newy, newtheta = 0;
                    environment_navxythetalat.GetCoordFromState(solution_stateIDs_V[j], newx, newy, newtheta);
                    if (x == newx && y == newy) bOnthePath = true;
                }

                if (index != startindex && index != goalindex && !bOnthePath) {
                    printf("%3d ", cost);
                }
                else if (index == startindex) {
                    printf("  X ");
                }
                else if (index == goalindex) {
                    printf("  G ");
                }
                else if (bOnthePath) {
                    printf("  * ");
                }
                else {
                    printf("? ");
                }
            }
            printf("\n");
        }

        // move along the path
        if (bPlanExists && (int)xythetaPath.size() > 1) {
            //get coord of the successor
            int newx, newy, newtheta;

            // move until we move into the end of motion primitive
            environment_navxythetalat.GetCoordFromState(solution_stateIDs_V[1], newx, newy, newtheta);

            printf("moving from %d %d %d to %d %d %d\n", startx_c, starty_c, starttheta_c, newx, newy, newtheta);

            // this check is weak since true configuration does not know the actual perimeter of the robot
            if (!trueenvironment_navxythetalat.IsValidConfiguration(newx, newy, newtheta)) {
                throw SBPL_Exception("ERROR: robot is commanded to move into an invalid configuration according to true environment");
            }

            // move
            startx = DISCXY2CONT(newx, cellsize_m);
            starty = DISCXY2CONT(newy, cellsize_m);
            starttheta = DiscTheta2Cont(newtheta, num_thetas);

            // update the environment
            int newstartstateID = environment_navxythetalat.SetStart(startx, starty, starttheta);

            // update the planner
            if (planner->set_start(newstartstateID) == 0) {
                throw SBPL_Exception("ERROR: failed to update robot pose in the planner");
            }
        }
        else {
            printf("No move is made\n");
        }

        if (bPrint) {
            printf("System Pause (return=%d)\n", system("pause"));
        }
    }

    printf("goal reached!\n");

    fflush(NULL);
    fclose(fSol);

    delete[] map;
    delete planner;

    return 1;
}